

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O3

tool_mime * tool_mime_new_parts(tool_mime *parent)

{
  tool_mime *ptVar1;
  
  ptVar1 = (tool_mime *)calloc(1,0x70);
  if (ptVar1 != (tool_mime *)0x0) {
    ptVar1->kind = TOOLMIME_PARTS;
    ptVar1->parent = parent;
    if (parent != (tool_mime *)0x0) {
      ptVar1->prev = parent->subparts;
      parent->subparts = ptVar1;
    }
  }
  return ptVar1;
}

Assistant:

static struct tool_mime *tool_mime_new_parts(struct tool_mime *parent)
{
  return tool_mime_new(parent, TOOLMIME_PARTS);
}